

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O3

void RandAddStaticEnv(CSHA512 *hasher)

{
  int iVar1;
  short *psVar2;
  undefined4 *puVar3;
  __pid_t _Var4;
  uchar *puVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  code *pcVar10;
  uint32_t subleaf;
  uint uVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  uint32_t maxsub;
  uint32_t cx;
  uint32_t bx;
  ifaddrs *ifad;
  uint32_t dx;
  utsname name;
  char hname [256];
  int local_300;
  __gid_t local_2f8;
  __gid_t local_2f4;
  __uid_t local_2f0;
  __uid_t local_2ec;
  __pid_t local_2e8;
  __pid_t local_2e4;
  undefined8 local_2e0;
  code *local_2d8;
  code *local_2d0;
  int local_2c4;
  utsname local_2c0;
  code *local_138 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2d8 = (code *)CONCAT71(local_2d8._1_7_,1);
  CSHA512::Write(hasher,(uchar *)&local_2d8,1);
  local_2c0.sysname[0] = '\b';
  local_2c0.sysname[1] = '\0';
  local_2c0.sysname[2] = '\0';
  local_2c0.sysname[3] = '\0';
  local_2c0.sysname[4] = '\0';
  local_2c0.sysname[5] = '\0';
  local_2c0.sysname[6] = '\0';
  local_2c0.sysname[7] = '\0';
  CSHA512::Write(hasher,(uchar *)&local_2c0,8);
  local_138[0] = (code *)0x8;
  CSHA512::Write(hasher,(uchar *)local_138,8);
  local_2d0 = (code *)0x4;
  CSHA512::Write(hasher,(uchar *)&local_2d0,8);
  local_2c0.sysname._0_4_ = 4;
  CSHA512::Write(hasher,(uchar *)&local_2c0,4);
  local_138[0] = (code *)CONCAT44(local_138[0]._4_4_,2);
  CSHA512::Write(hasher,(uchar *)local_138,4);
  local_2d0 = (code *)CONCAT44(local_2d0._4_4_,1);
  CSHA512::Write(hasher,(uchar *)&local_2d0,4);
  local_2c0.sysname[0] = '\x12';
  local_2c0.sysname[1] = '\x15';
  local_2c0.sysname[2] = '\x03';
  local_2c0.sysname[3] = '\0';
  local_2c0.sysname[4] = '\0';
  local_2c0.sysname[5] = '\0';
  local_2c0.sysname[6] = '\0';
  local_2c0.sysname[7] = '\0';
  CSHA512::Write(hasher,(uchar *)&local_2c0,8);
  local_2c0.sysname._0_4_ = 700;
  CSHA512::Write(hasher,(uchar *)&local_2c0,4);
  CSHA512::Write(hasher,(uchar *)
                        "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
                 ,0x66);
  CSHA512::Write(hasher,(uchar *)&CLIENT_VERSION,4);
  local_2c0.sysname._0_8_ = getauxval(0x10);
  CSHA512::Write(hasher,(uchar *)&local_2c0,8);
  local_2c0.sysname._0_8_ = getauxval(0x1a);
  CSHA512::Write(hasher,(uchar *)&local_2c0,8);
  puVar5 = (uchar *)getauxval(0x19);
  if (puVar5 != (uchar *)0x0) {
    CSHA512::Write(hasher,puVar5,0x10);
  }
  puVar5 = (uchar *)getauxval(0xf);
  if (puVar5 != (uchar *)0x0) {
    sVar6 = strlen((char *)puVar5);
    CSHA512::Write(hasher,puVar5,sVar6 + 1);
  }
  puVar5 = (uchar *)getauxval(0x1f);
  if (puVar5 != (uchar *)0x0) {
    sVar6 = strlen((char *)puVar5);
    CSHA512::Write(hasher,puVar5,sVar6 + 1);
  }
  puVar3 = (undefined4 *)cpuid_basic_info(0);
  local_2c4 = puVar3[2];
  local_2c0.sysname._0_8_ = local_2c0.sysname._0_8_ & 0xffffffff00000000;
  local_138[0] = (code *)((ulong)local_138[0] & 0xffffffff00000000);
  local_2d0 = (code *)CONCAT44(local_2d0._4_4_,*puVar3);
  local_2d8 = (code *)CONCAT44(local_2d8._4_4_,puVar3[1]);
  local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,puVar3[3]);
  CSHA512::Write(hasher,(uchar *)&local_2c0,4);
  CSHA512::Write(hasher,(uchar *)local_138,4);
  CSHA512::Write(hasher,(uchar *)&local_2d0,4);
  CSHA512::Write(hasher,(uchar *)&local_2d8,4);
  CSHA512::Write(hasher,(uchar *)&local_2e0,4);
  CSHA512::Write(hasher,(uchar *)&local_2c4,4);
  if ((uint)local_2d0 != 0) {
    uVar7 = (uint)local_2d0 - 1;
    if (0xfd < uVar7) {
      uVar7 = 0xfe;
    }
    uVar11 = 1;
    do {
      iVar8 = 0;
      local_300 = 0;
      do {
        if (uVar11 == 0) {
          puVar3 = (undefined4 *)cpuid_basic_info(0);
        }
        else if (uVar11 == 1) {
          puVar3 = (undefined4 *)cpuid_Version_info(1);
        }
        else if (uVar11 == 2) {
          puVar3 = (undefined4 *)cpuid_cache_tlb_info(2);
        }
        else if (uVar11 == 3) {
          puVar3 = (undefined4 *)cpuid_serial_info(3);
        }
        else if (uVar11 == 4) {
          puVar3 = (undefined4 *)cpuid_Deterministic_Cache_Parameters_info(4);
        }
        else if (uVar11 == 5) {
          puVar3 = (undefined4 *)cpuid_MONITOR_MWAIT_Features_info(5);
        }
        else if (uVar11 == 6) {
          puVar3 = (undefined4 *)cpuid_Thermal_Power_Management_info(6);
        }
        else if (uVar11 == 7) {
          puVar3 = (undefined4 *)cpuid_Extended_Feature_Enumeration_info(7);
        }
        else if (uVar11 == 9) {
          puVar3 = (undefined4 *)cpuid_Direct_Cache_Access_info(9);
        }
        else if (uVar11 == 10) {
          puVar3 = (undefined4 *)cpuid_Architectural_Performance_Monitoring_info(10);
        }
        else if (uVar11 == 0xb) {
          puVar3 = (undefined4 *)cpuid_Extended_Topology_info(0xb);
        }
        else if (uVar11 == 0xd) {
          puVar3 = (undefined4 *)cpuid_Processor_Extended_States_info(0xd);
        }
        else if (uVar11 == 0xf) {
          puVar3 = (undefined4 *)cpuid_Quality_of_Service_info(0xf);
        }
        else if (uVar11 == 0x80000002) {
          puVar3 = (undefined4 *)cpuid_brand_part1_info(0x80000002);
        }
        else if (uVar11 == 0x80000003) {
          puVar3 = (undefined4 *)cpuid_brand_part2_info(0x80000003);
        }
        else if (uVar11 == 0x80000004) {
          puVar3 = (undefined4 *)cpuid_brand_part3_info(0x80000004);
        }
        else {
          puVar3 = (undefined4 *)cpuid(uVar11);
        }
        local_2c4 = puVar3[2];
        local_2c0.sysname._0_4_ = uVar11;
        local_138[0] = (code *)CONCAT44(local_138[0]._4_4_,iVar8);
        local_2d0 = (code *)CONCAT44(local_2d0._4_4_,*puVar3);
        local_2d8 = (code *)CONCAT44(local_2d8._4_4_,puVar3[1]);
        local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,puVar3[3]);
        CSHA512::Write(hasher,(uchar *)&local_2c0,4);
        CSHA512::Write(hasher,(uchar *)local_138,4);
        CSHA512::Write(hasher,(uchar *)&local_2d0,4);
        CSHA512::Write(hasher,(uchar *)&local_2d8,4);
        CSHA512::Write(hasher,(uchar *)&local_2e0,4);
        CSHA512::Write(hasher,(uchar *)&local_2c4,4);
        switch(uVar11 & 0xff) {
        case 4:
          if (((ulong)local_2d0 & 0x1f) == 0) goto switchD_00173afa_caseD_5;
          break;
        default:
          goto switchD_00173afa_caseD_5;
        case 7:
          if (iVar8 == 0) {
            local_300 = (uint)local_2d0;
          }
          if (iVar8 == local_300) goto switchD_00173afa_caseD_5;
          break;
        case 0xb:
          if (local_2e0._1_1_ == '\0') goto switchD_00173afa_caseD_5;
          break;
        case 0xd:
          if (((((uint)local_2d0 == 0) && ((int)local_2d8 == 0)) && ((int)local_2e0 == 0)) &&
             (local_2c4 == 0)) goto switchD_00173afa_caseD_5;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0x100);
switchD_00173afa_caseD_5:
      bVar13 = uVar11 != uVar7 + 1;
      uVar11 = uVar11 + 1;
    } while (bVar13);
  }
  puVar3 = (undefined4 *)cpuid(0x80000000);
  local_2c4 = puVar3[2];
  local_2c0.sysname._0_4_ = 0x80000000;
  local_138[0] = (code *)((ulong)local_138[0] & 0xffffffff00000000);
  local_2d0 = (code *)CONCAT44(local_2d0._4_4_,*puVar3);
  local_2d8 = (code *)CONCAT44(local_2d8._4_4_,puVar3[1]);
  local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,puVar3[3]);
  CSHA512::Write(hasher,(uchar *)&local_2c0,4);
  CSHA512::Write(hasher,(uchar *)local_138,4);
  CSHA512::Write(hasher,(uchar *)&local_2d0,4);
  CSHA512::Write(hasher,(uchar *)&local_2d8,4);
  CSHA512::Write(hasher,(uchar *)&local_2e0,4);
  CSHA512::Write(hasher,(uchar *)&local_2c4,4);
  if (0x80000000 < (uint)local_2d0) {
    uVar7 = (uint)local_2d0 + 0x7fffffff;
    if (0xfd < uVar7) {
      uVar7 = 0xfe;
    }
    iVar8 = -0x7fffffff;
    do {
      if (iVar8 == 0) {
        puVar3 = (undefined4 *)cpuid_basic_info(0);
      }
      else if (iVar8 == 1) {
        puVar3 = (undefined4 *)cpuid_Version_info(1);
      }
      else if (iVar8 == 2) {
        puVar3 = (undefined4 *)cpuid_cache_tlb_info(2);
      }
      else if (iVar8 == 3) {
        puVar3 = (undefined4 *)cpuid_serial_info(3);
      }
      else if (iVar8 == 4) {
        puVar3 = (undefined4 *)cpuid_Deterministic_Cache_Parameters_info(4);
      }
      else if (iVar8 == 5) {
        puVar3 = (undefined4 *)cpuid_MONITOR_MWAIT_Features_info(5);
      }
      else if (iVar8 == 6) {
        puVar3 = (undefined4 *)cpuid_Thermal_Power_Management_info(6);
      }
      else if (iVar8 == 7) {
        puVar3 = (undefined4 *)cpuid_Extended_Feature_Enumeration_info(7);
      }
      else if (iVar8 == 9) {
        puVar3 = (undefined4 *)cpuid_Direct_Cache_Access_info(9);
      }
      else if (iVar8 == 10) {
        puVar3 = (undefined4 *)cpuid_Architectural_Performance_Monitoring_info(10);
      }
      else if (iVar8 == 0xb) {
        puVar3 = (undefined4 *)cpuid_Extended_Topology_info(0xb);
      }
      else if (iVar8 == 0xd) {
        puVar3 = (undefined4 *)cpuid_Processor_Extended_States_info(0xd);
      }
      else if (iVar8 == 0xf) {
        puVar3 = (undefined4 *)cpuid_Quality_of_Service_info(0xf);
      }
      else if (iVar8 == -0x7ffffffe) {
        puVar3 = (undefined4 *)cpuid_brand_part1_info(0x80000002);
      }
      else if (iVar8 == -0x7ffffffd) {
        puVar3 = (undefined4 *)cpuid_brand_part2_info(0x80000003);
      }
      else if (iVar8 == -0x7ffffffc) {
        puVar3 = (undefined4 *)cpuid_brand_part3_info(0x80000004);
      }
      else {
        puVar3 = (undefined4 *)cpuid(iVar8);
      }
      local_2c4 = puVar3[2];
      local_2c0.sysname._0_4_ = iVar8;
      local_138[0] = (code *)((ulong)local_138[0] & 0xffffffff00000000);
      local_2d0 = (code *)CONCAT44(local_2d0._4_4_,*puVar3);
      local_2d8 = (code *)CONCAT44(local_2d8._4_4_,puVar3[1]);
      local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,puVar3[3]);
      CSHA512::Write(hasher,(uchar *)&local_2c0,4);
      CSHA512::Write(hasher,(uchar *)local_138,4);
      CSHA512::Write(hasher,(uchar *)&local_2d0,4);
      CSHA512::Write(hasher,(uchar *)&local_2d8,4);
      CSHA512::Write(hasher,(uchar *)&local_2e0,4);
      CSHA512::Write(hasher,(uchar *)&local_2c4,4);
      iVar1 = iVar8 - uVar7;
      iVar8 = iVar8 + 1;
    } while (iVar1 != -0x7fffffff);
  }
  local_2c0.sysname._0_8_ = hasher;
  CSHA512::Write(hasher,(uchar *)&local_2c0,8);
  local_138[0] = RandAddStaticEnv;
  CSHA512::Write(hasher,(uchar *)local_138,8);
  local_2d0 = malloc;
  CSHA512::Write(hasher,(uchar *)&local_2d0,8);
  local_2d8 = (code *)__errno_location();
  CSHA512::Write(hasher,(uchar *)&local_2d8,8);
  local_2e0 = &environ;
  CSHA512::Write(hasher,(uchar *)&local_2e0,8);
  iVar8 = gethostname((char *)local_138,0x100);
  if (iVar8 == 0) {
    sVar6 = strnlen((char *)local_138,0x100);
    CSHA512::Write(hasher,(uchar *)local_138,sVar6);
  }
  local_2d0 = (code *)0x0;
  getifaddrs(&local_2d0);
  local_2d8 = local_2d0;
  if (local_2d0 == (code *)0x0) {
    pcVar10 = (code *)0x0;
  }
  else {
    do {
      CSHA512::Write(hasher,(uchar *)&local_2d8,8);
      puVar5 = *(uchar **)(local_2d8 + 8);
      sVar6 = strlen((char *)puVar5);
      CSHA512::Write(hasher,puVar5,sVar6 + 1);
      CSHA512::Write(hasher,(uchar *)(local_2d8 + 0x10),4);
      psVar2 = *(short **)(local_2d8 + 0x18);
      if (psVar2 != (short *)0x0) {
        sVar9 = 2;
        if (*psVar2 == 10) {
          sVar9 = 0x1c;
        }
        if (*psVar2 == 2) {
          sVar9 = 0x10;
        }
        CSHA512::Write(hasher,(uchar *)psVar2,sVar9);
      }
      psVar2 = *(short **)(local_2d8 + 0x20);
      if (psVar2 != (short *)0x0) {
        sVar9 = 2;
        if (*psVar2 == 10) {
          sVar9 = 0x1c;
        }
        if (*psVar2 == 2) {
          sVar9 = 0x10;
        }
        CSHA512::Write(hasher,(uchar *)psVar2,sVar9);
      }
      psVar2 = *(short **)(local_2d8 + 0x28);
      if (psVar2 != (short *)0x0) {
        sVar9 = 2;
        if (*psVar2 == 10) {
          sVar9 = 0x1c;
        }
        if (*psVar2 == 2) {
          sVar9 = 0x10;
        }
        CSHA512::Write(hasher,(uchar *)psVar2,sVar9);
      }
      local_2d8 = *(code **)local_2d8;
    } while (local_2d8 != (code *)0x0);
    local_2d8 = (code *)0x0;
    pcVar10 = local_2d0;
  }
  freeifaddrs(pcVar10);
  iVar8 = uname(&local_2c0);
  if (iVar8 != -1) {
    sVar6 = strlen(local_2c0.sysname);
    CSHA512::Write(hasher,(uchar *)&local_2c0,sVar6 + 1);
    sVar6 = strlen(local_2c0.nodename);
    CSHA512::Write(hasher,(uchar *)local_2c0.nodename,sVar6 + 1);
    sVar6 = strlen(local_2c0.release);
    CSHA512::Write(hasher,(uchar *)local_2c0.release,sVar6 + 1);
    sVar6 = strlen(local_2c0.version);
    CSHA512::Write(hasher,(uchar *)local_2c0.version,sVar6 + 1);
    sVar6 = strlen(local_2c0.machine);
    CSHA512::Write(hasher,(uchar *)local_2c0.machine,sVar6 + 1);
  }
  anon_unknown.dwarf_281779::AddPath(hasher,"/");
  anon_unknown.dwarf_281779::AddPath(hasher,".");
  anon_unknown.dwarf_281779::AddPath(hasher,"/tmp");
  anon_unknown.dwarf_281779::AddPath(hasher,"/home");
  anon_unknown.dwarf_281779::AddPath(hasher,"/proc");
  anon_unknown.dwarf_281779::AddFile(hasher,"/proc/cmdline");
  anon_unknown.dwarf_281779::AddFile(hasher,"/proc/cpuinfo");
  anon_unknown.dwarf_281779::AddFile(hasher,"/proc/version");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/passwd");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/group");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/hosts");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/resolv.conf");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/timezone");
  anon_unknown.dwarf_281779::AddFile(hasher,"/etc/localtime");
  if ((_environ != (long *)0x0) && (puVar5 = (uchar *)*_environ, puVar5 != (uchar *)0x0)) {
    lVar12 = 8;
    do {
      sVar6 = strlen((char *)puVar5);
      CSHA512::Write(hasher,puVar5,sVar6);
      puVar5 = *(uchar **)((long)_environ + lVar12);
      lVar12 = lVar12 + 8;
    } while (puVar5 != (uchar *)0x0);
  }
  _Var4 = getpid();
  local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,_Var4);
  CSHA512::Write(hasher,(uchar *)&local_2e0,4);
  local_2c4 = getppid();
  CSHA512::Write(hasher,(uchar *)&local_2c4,4);
  local_2e4 = getsid(0);
  CSHA512::Write(hasher,(uchar *)&local_2e4,4);
  local_2e8 = getpgid(0);
  CSHA512::Write(hasher,(uchar *)&local_2e8,4);
  local_2ec = getuid();
  CSHA512::Write(hasher,(uchar *)&local_2ec,4);
  local_2f0 = geteuid();
  CSHA512::Write(hasher,(uchar *)&local_2f0,4);
  local_2f4 = getgid();
  CSHA512::Write(hasher,(uchar *)&local_2f4,4);
  local_2f8 = getegid();
  CSHA512::Write(hasher,(uchar *)&local_2f8,4);
  local_2e0 = (undefined *)pthread_self();
  CSHA512::Write(hasher,(uchar *)&local_2e0,8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void RandAddStaticEnv(CSHA512& hasher)
{
    // Some compile-time static properties
    hasher << (CHAR_MIN < 0) << sizeof(void*) << sizeof(long) << sizeof(int);
#if defined(__GNUC__) && defined(__GNUC_MINOR__) && defined(__GNUC_PATCHLEVEL__)
    hasher << __GNUC__ << __GNUC_MINOR__ << __GNUC_PATCHLEVEL__;
#endif
#ifdef _MSC_VER
    hasher << _MSC_VER;
#endif
    hasher << __cplusplus;
#ifdef _XOPEN_VERSION
    hasher << _XOPEN_VERSION;
#endif
#ifdef __VERSION__
    const char* COMPILER_VERSION = __VERSION__;
    hasher.Write((const unsigned char*)COMPILER_VERSION, strlen(COMPILER_VERSION) + 1);
#endif

    // Bitcoin client version
    hasher << CLIENT_VERSION;

#if defined(HAVE_STRONG_GETAUXVAL)
    // Information available through getauxval()
#  ifdef AT_HWCAP
    hasher << getauxval(AT_HWCAP);
#  endif
#  ifdef AT_HWCAP2
    hasher << getauxval(AT_HWCAP2);
#  endif
#  ifdef AT_RANDOM
    const unsigned char* random_aux = (const unsigned char*)getauxval(AT_RANDOM);
    if (random_aux) hasher.Write(random_aux, 16);
#  endif
#  ifdef AT_PLATFORM
    const char* platform_str = (const char*)getauxval(AT_PLATFORM);
    if (platform_str) hasher.Write((const unsigned char*)platform_str, strlen(platform_str) + 1);
#  endif
#  ifdef AT_EXECFN
    const char* exec_str = (const char*)getauxval(AT_EXECFN);
    if (exec_str) hasher.Write((const unsigned char*)exec_str, strlen(exec_str) + 1);
#  endif
#endif // HAVE_STRONG_GETAUXVAL

#ifdef HAVE_GETCPUID
    AddAllCPUID(hasher);
#endif

    // Memory locations
    hasher << &hasher << &RandAddStaticEnv << &malloc << &errno << &environ;

    // Hostname
#ifdef WIN32
    constexpr DWORD max_size = MAX_COMPUTERNAME_LENGTH + 1;
    char hname[max_size];
    DWORD size = max_size;
    if (GetComputerNameA(hname, &size) != 0) {
        hasher.Write(UCharCast(hname), size);
    }
#else
    char hname[256];
    if (gethostname(hname, 256) == 0) {
        hasher.Write((const unsigned char*)hname, strnlen(hname, 256));
    }
#endif

#if HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS
    // Network interfaces
    struct ifaddrs *ifad = nullptr;
    getifaddrs(&ifad);
    struct ifaddrs *ifit = ifad;
    while (ifit != nullptr) {
        hasher.Write((const unsigned char*)&ifit, sizeof(ifit));
        hasher.Write((const unsigned char*)ifit->ifa_name, strlen(ifit->ifa_name) + 1);
        hasher.Write((const unsigned char*)&ifit->ifa_flags, sizeof(ifit->ifa_flags));
        AddSockaddr(hasher, ifit->ifa_addr);
        AddSockaddr(hasher, ifit->ifa_netmask);
        AddSockaddr(hasher, ifit->ifa_dstaddr);
        ifit = ifit->ifa_next;
    }
    freeifaddrs(ifad);
#endif

#ifndef WIN32
    // UNIX kernel information
    struct utsname name;
    if (uname(&name) != -1) {
        hasher.Write((const unsigned char*)&name.sysname, strlen(name.sysname) + 1);
        hasher.Write((const unsigned char*)&name.nodename, strlen(name.nodename) + 1);
        hasher.Write((const unsigned char*)&name.release, strlen(name.release) + 1);
        hasher.Write((const unsigned char*)&name.version, strlen(name.version) + 1);
        hasher.Write((const unsigned char*)&name.machine, strlen(name.machine) + 1);
    }

    /* Path and filesystem provided data */
    AddPath(hasher, "/");
    AddPath(hasher, ".");
    AddPath(hasher, "/tmp");
    AddPath(hasher, "/home");
    AddPath(hasher, "/proc");
#ifdef __linux__
    AddFile(hasher, "/proc/cmdline");
    AddFile(hasher, "/proc/cpuinfo");
    AddFile(hasher, "/proc/version");
#endif
    AddFile(hasher, "/etc/passwd");
    AddFile(hasher, "/etc/group");
    AddFile(hasher, "/etc/hosts");
    AddFile(hasher, "/etc/resolv.conf");
    AddFile(hasher, "/etc/timezone");
    AddFile(hasher, "/etc/localtime");
#endif

    // For MacOS/BSDs, gather data through sysctl instead of /proc. Not all of these
    // will exist on every system.
#ifdef HAVE_SYSCTL
#  ifdef CTL_HW
#    ifdef HW_MACHINE
    AddSysctl<CTL_HW, HW_MACHINE>(hasher);
#    endif
#    ifdef HW_MODEL
    AddSysctl<CTL_HW, HW_MODEL>(hasher);
#    endif
#    ifdef HW_NCPU
    AddSysctl<CTL_HW, HW_NCPU>(hasher);
#    endif
#    ifdef HW_PHYSMEM
    AddSysctl<CTL_HW, HW_PHYSMEM>(hasher);
#    endif
#    ifdef HW_USERMEM
    AddSysctl<CTL_HW, HW_USERMEM>(hasher);
#    endif
#    ifdef HW_MACHINE_ARCH
    AddSysctl<CTL_HW, HW_MACHINE_ARCH>(hasher);
#    endif
#    ifdef HW_REALMEM
    AddSysctl<CTL_HW, HW_REALMEM>(hasher);
#    endif
#    ifdef HW_CPU_FREQ
    AddSysctl<CTL_HW, HW_CPU_FREQ>(hasher);
#    endif
#    ifdef HW_BUS_FREQ
    AddSysctl<CTL_HW, HW_BUS_FREQ>(hasher);
#    endif
#    ifdef HW_CACHELINE
    AddSysctl<CTL_HW, HW_CACHELINE>(hasher);
#    endif
#  endif
#  ifdef CTL_KERN
#    ifdef KERN_BOOTFILE
     AddSysctl<CTL_KERN, KERN_BOOTFILE>(hasher);
#    endif
#    ifdef KERN_BOOTTIME
     AddSysctl<CTL_KERN, KERN_BOOTTIME>(hasher);
#    endif
#    ifdef KERN_CLOCKRATE
     AddSysctl<CTL_KERN, KERN_CLOCKRATE>(hasher);
#    endif
#    ifdef KERN_HOSTID
     AddSysctl<CTL_KERN, KERN_HOSTID>(hasher);
#    endif
#    ifdef KERN_HOSTUUID
     AddSysctl<CTL_KERN, KERN_HOSTUUID>(hasher);
#    endif
#    ifdef KERN_HOSTNAME
     AddSysctl<CTL_KERN, KERN_HOSTNAME>(hasher);
#    endif
#    ifdef KERN_OSRELDATE
     AddSysctl<CTL_KERN, KERN_OSRELDATE>(hasher);
#    endif
#    ifdef KERN_OSRELEASE
     AddSysctl<CTL_KERN, KERN_OSRELEASE>(hasher);
#    endif
#    ifdef KERN_OSREV
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_OSTYPE
     AddSysctl<CTL_KERN, KERN_OSTYPE>(hasher);
#    endif
#    ifdef KERN_POSIX1
     AddSysctl<CTL_KERN, KERN_OSREV>(hasher);
#    endif
#    ifdef KERN_VERSION
     AddSysctl<CTL_KERN, KERN_VERSION>(hasher);
#    endif
#  endif
#endif

    // Env variables
    if (environ) {
        for (size_t i = 0; environ[i]; ++i) {
            hasher.Write((const unsigned char*)environ[i], strlen(environ[i]));
        }
    }

    // Process, thread, user, session, group, ... ids.
#ifdef WIN32
    hasher << GetCurrentProcessId() << GetCurrentThreadId();
#else
    hasher << getpid() << getppid() << getsid(0) << getpgid(0) << getuid() << geteuid() << getgid() << getegid();
#endif
    hasher << std::this_thread::get_id();
}